

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalbackingstore.cpp
# Opt level: O2

void __thiscall
QMinimalBackingStore::flush
          (QMinimalBackingStore *this,QWindow *window,QRegion *region,QPoint *offset)

{
  int a;
  QDebug *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_88;
  QArrayDataPointer<char16_t> local_70;
  char *local_58;
  QDebug local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->mDebug == true) {
    local_48.size = -0x5555555555555556;
    local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)&local_70,"output%1.png");
    a = flush::c;
    flush::c = flush::c + 1;
    QString::arg<int,_true>((QString *)&local_48,(QString *)&local_70,a,4,10,(QChar)0x30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    local_70.d._0_4_ = 2;
    local_70.size._4_4_ = 0;
    local_70._4_8_ = 0;
    local_70._12_8_ = 0;
    local_58 = "default";
    QMessageLogger::debug();
    this_00 = QDebug::operator<<(local_50,"QMinimalBackingStore::flush() saving contents to");
    QString::toLocal8Bit((QByteArray *)&QStack_88,(QString *)&local_48);
    if (QStack_88.ptr == (char *)0x0) {
      QStack_88.ptr = (char *)&QByteArray::_empty;
    }
    QDebug::operator<<(this_00,QStack_88.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_88);
    QDebug::~QDebug(local_50);
    QImage::save((QString *)&this->mImage,(char *)&local_48,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMinimalBackingStore::flush(QWindow *window, const QRegion &region, const QPoint &offset)
{
    Q_UNUSED(window);
    Q_UNUSED(region);
    Q_UNUSED(offset);

    if (mDebug) {
        static int c = 0;
        QString filename = QString("output%1.png").arg(c++, 4, 10, QChar(u'0'));
        qDebug() << "QMinimalBackingStore::flush() saving contents to" << filename.toLocal8Bit().constData();
        mImage.save(filename);
    }
}